

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

bool __thiscall
DReachabilityPropagator::_propagateReachability(DReachabilityPropagator *this,bool local)

{
  Tint *pTVar1;
  anon_union_8_2_743a5d44_for_Reason_0 aVar2;
  byte bVar3;
  uint uVar4;
  pointer pvVar5;
  uint *puVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  BoolView *pBVar10;
  char *pcVar11;
  uint uVar12;
  anon_union_8_2_743a5d44_for_Reason_0 aVar13;
  uint uVar14;
  undefined7 in_register_00000031;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  FilteredLT *pFVar18;
  int *pt;
  uint *puVar19;
  uint *puVar20;
  int *pt_1;
  ulong uVar21;
  uint *puVar22;
  int dom_u;
  int last_incident;
  Clause *expl;
  uint local_e0;
  uint local_dc;
  vec<Lit> local_d8;
  anon_union_8_2_743a5d44_for_Reason_0 local_c0;
  undefined4 local_b4;
  anon_union_8_2_743a5d44_for_Reason_0 local_b0;
  uint local_a8;
  undefined4 local_a4;
  vector<bool,_std::allocator<bool>_> local_88;
  anon_union_8_2_743a5d44_for_Reason_0 local_60;
  vec<TrailElem> *local_58;
  vec<TrailElem> *local_50;
  uint *local_48;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_40;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_38;
  
  local_b4 = (undefined4)CONCAT71(in_register_00000031,local);
  iVar8 = (this->in_nodes_tsize).v;
  if (iVar8 < this->in_nodes_size) {
    std::vector<int,_std::allocator<int>_>::resize(&this->in_nodes_list,(long)iVar8);
    this->in_nodes_size = (this->in_nodes_tsize).v;
  }
  (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[1])();
  pFVar18 = this->lt;
  (**(pFVar18->super_LengauerTarjan)._vptr_LengauerTarjan)
            (pFVar18,(ulong)(uint)(pFVar18->super_LengauerTarjan).root);
  pFVar18 = this->lt;
  if (pFVar18->visited_innodes < (this->in_nodes_tsize).v) {
    if (so.lazy == true) {
      puVar20 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
      uVar14 = 0xffffffff;
      for (puVar22 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start; puVar22 != puVar20;
          puVar22 = puVar22 + 1) {
        uVar12 = *puVar22;
        iVar8 = (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[7])(this->lt,(ulong)uVar12);
        if ((char)iVar8 == '\0') {
          uVar14 = uVar12;
        }
      }
      local_d8.sz = 0;
      local_d8.cap = 0;
      local_d8.data = (Lit *)0x0;
      uVar12 = (this->super_GraphPropagator).vs.data[(uint)this->root].v;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._0_4_ =
           (uint)((int)sat.assigns.data[uVar12] - 1U < 0xfffffffd) + uVar12 * 2;
      vec<Lit>::push(&local_d8,(Lit *)&local_88);
      uVar12 = (this->super_GraphPropagator).vs.data[uVar14].v;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                    (uint)((int)sat.assigns.data[uVar12] - 1U < 0xfffffffd) + uVar12 * 2);
      vec<Lit>::push(&local_d8,(Lit *)&local_88);
      local_b0._a = local_b0._a & 0xffffffffffffff00;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&local_88,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_b0,
                 (allocator_type *)&local_c0);
      local_c0._a = local_c0._a & 0xffffffffffffff00;
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&local_b0,
                 (long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_c0,
                 (allocator_type *)&local_e0);
      reverseDFStoBorder(this,uVar14,&local_88,(vector<bool,_std::allocator<bool>_> *)&local_b0,
                         &local_d8,-1);
      uVar14 = local_d8.sz;
      uVar21 = local_d8._0_8_ & 0xffffffff;
      sVar17 = 8;
      if (local_d8.sz != 0) {
        sVar17 = (ulong)(local_d8.sz - 1) * 4 + 8;
      }
      local_c0._pt = (Clause *)malloc(sVar17);
      uVar12 = uVar14 << 8;
      (local_c0._pt)->data[0].x = -2;
      *(uint *)local_c0._pt = uVar12;
      if (uVar14 != 0) {
        uVar16 = 0;
        do {
          (local_c0._pt)->data[uVar16].x = local_d8.data[uVar16].x;
          uVar16 = uVar16 + 1;
        } while (uVar21 != uVar16);
      }
      *(uint *)local_c0._pt = uVar12 | 2;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_c0._pt);
      sat.confl = local_c0._pt;
      if (local_b0._pt != (Clause *)0x0) {
        operator_delete(local_b0._pt);
      }
      if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_d8.data != (Lit *)0x0) {
        free(local_d8.data);
      }
    }
LAB_001ce5fc:
    bVar7 = false;
  }
  else {
    if (0 < (int)(this->super_GraphPropagator).vs.sz) {
      uVar21 = 0;
      local_58 = &engine.trail;
      do {
        iVar8 = (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[7])
                          (this->lt,uVar21 & 0xffffffff);
        if ((char)iVar8 == '\0') {
          pBVar10 = (this->super_GraphPropagator).vs.data;
          if (sat.assigns.data[(uint)pBVar10[uVar21].v] == '\0') {
            if (so.lazy == true) {
              local_d8.sz = 0;
              local_d8.cap = 0;
              local_d8.data = (Lit *)0x0;
              vec<Lit>::push(&local_d8);
              uVar14 = (this->super_GraphPropagator).vs.data[(uint)this->root].v;
              local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p =
                   (_Bit_type *)
                   CONCAT44(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                            (uint)((int)sat.assigns.data[uVar14] - 1U < 0xfffffffd) + uVar14 * 2);
              vec<Lit>::push(&local_d8,(Lit *)&local_88);
              local_b0._a = local_b0._a & 0xffffffffffffff00;
              std::vector<bool,_std::allocator<bool>_>::vector
                        (&local_88,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_b0,
                         (allocator_type *)&local_c0);
              local_c0._a = local_c0._a & 0xffffffffffffff00;
              std::vector<bool,_std::allocator<bool>_>::vector
                        ((vector<bool,_std::allocator<bool>_> *)&local_b0,
                         (long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_c0,
                         (allocator_type *)&local_e0);
              reverseDFStoBorder(this,(int)uVar21,&local_88,
                                 (vector<bool,_std::allocator<bool>_> *)&local_b0,&local_d8,-1);
              uVar14 = local_d8.sz;
              uVar16 = local_d8._0_8_ & 0xffffffff;
              sVar17 = (ulong)(local_d8.sz - 1) * 4 + 8;
              if (local_d8.sz == 0) {
                sVar17 = 8;
              }
              local_c0._pt = (Clause *)malloc(sVar17);
              uVar12 = uVar14 << 8;
              (local_c0._pt)->data[0].x = -2;
              *(uint *)local_c0._pt = uVar12;
              if (uVar14 != 0) {
                uVar15 = 0;
                do {
                  (local_c0._pt)->data[uVar15].x = local_d8.data[uVar15].x;
                  uVar15 = uVar15 + 1;
                } while (uVar16 != uVar15);
              }
              *(uint *)local_c0._pt = uVar12 | 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_c0._pt);
              aVar13 = local_c0;
              if (local_b0._pt != (Clause *)0x0) {
                operator_delete(local_b0._pt);
              }
              if ((Tint *)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  (Tint *)0x0) {
                operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              }
              if (local_d8.data != (Lit *)0x0) {
                free(local_d8.data);
              }
              pBVar10 = (this->super_GraphPropagator).vs.data;
            }
            else {
              aVar13._pt = (Clause *)0x0;
            }
            SAT::cEnqueue(&sat,(Lit)((pBVar10[uVar21].s ^ 1) + pBVar10[uVar21].v * 2),(Reason)aVar13
                         );
            if ((char)local_b4 != '\0') {
              iVar8 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x13])
                                (this,uVar21 & 0xffffffff);
              if ((char)iVar8 == '\0') goto LAB_001ce5fc;
              pTVar1 = this->last_state_n + uVar21;
              local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_offset = pTVar1->v;
              local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._12_4_ = 4;
              local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)pTVar1;
              vec<TrailElem>::push(local_58,(TrailElem *)&local_88);
              pTVar1->v = 1;
            }
          }
        }
        uVar21 = uVar21 + 1;
      } while ((long)uVar21 < (long)(int)(this->super_GraphPropagator).vs.sz);
      pFVar18 = this->lt;
    }
    (*(pFVar18->super_LengauerTarjan)._vptr_LengauerTarjan[3])();
    puVar22 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    puVar20 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
    bVar7 = true;
    if (puVar22 != puVar20) {
      local_38 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->new_node;
      local_40 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->new_edge;
      local_58 = (vec<TrailElem> *)0x800000000000003f;
      local_50 = &engine.trail;
      local_48 = puVar20;
      do {
        uVar14 = *puVar22;
        local_e0 = (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[8])
                             (this->lt,(ulong)uVar14);
        if (((uVar14 != local_e0) && (local_e0 != 0xffffffff)) && (uVar14 != this->root)) {
          local_b0._a = local_b0._a & 0xffffffffffffff00;
          std::vector<bool,_std::allocator<bool>_>::vector
                    (&local_88,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_b0,
                     (allocator_type *)&local_d8);
          uVar21 = (ulong)(int)uVar14;
          uVar12 = uVar14 + 0x3f;
          if (-1 < (int)uVar14) {
            uVar12 = uVar14;
          }
          if ((*(ulong *)((long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         ((long)((int)uVar12 >> 6) * 2 +
                         (ulong)((uVar21 & (ulong)local_58) < 0x8000000000000001) * 2 + -2) * 4) >>
               (uVar21 & 0x3f) & 1) != 0) {
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_e0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,this->root);
            local_b0._a._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_b0._a,1);
          }
          local_c0._pt = (Clause *)0x0;
          uVar16 = (ulong)local_e0;
          pBVar10 = (this->super_GraphPropagator).vs.data;
          if (sat.assigns.data[(uint)pBVar10[uVar16].v] == '\0') {
            if (so.lazy == true) {
              explain_dominator(this,uVar14,local_e0,&local_c0._pt);
              uVar16 = (ulong)local_e0;
              pBVar10 = (this->super_GraphPropagator).vs.data;
            }
            aVar13 = local_c0;
            SAT::cEnqueue(&sat,(Lit)((uint)pBVar10[uVar16].s + pBVar10[uVar16].v * 2),
                          (Reason)local_c0);
            uVar16 = (ulong)local_e0;
            if ((char)local_b4 == '\0') goto LAB_001ce16f;
            add_innode(this,local_e0);
            iVar8 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x14])
                              (this,(ulong)local_e0);
            if ((char)iVar8 != '\0') {
              aVar2._pt = (Clause *)(this->last_state_n + (int)local_e0);
              local_a8 = *(uint *)aVar2._pt;
              local_a4 = 4;
              local_b0._pt = aVar2._pt;
              vec<TrailElem>::push(local_50,(TrailElem *)&local_b0);
              puVar20 = local_48;
              *(uint *)aVar2._pt = 0;
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>(local_38,(int *)&local_e0);
              uVar16 = (ulong)local_e0;
              goto LAB_001ce16f;
            }
LAB_001ce438:
            bVar7 = false;
          }
          else {
            local_60._pt = (Clause *)0x0;
            aVar13._pt = local_60._pt;
LAB_001ce16f:
            local_60 = aVar13;
            pBVar10 = (this->super_GraphPropagator).vs.data;
            bVar7 = true;
            if ((sat.assigns.data[(uint)pBVar10[uVar16].v] != '\0') &&
               ((uint)pBVar10[uVar16].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar10[uVar16].v]))
            {
              local_dc = 0xffffffff;
              local_d8.sz = 0;
              local_d8.cap = 0;
              local_d8.data = (Lit *)0x0;
              if (so.lazy == true) {
                vec<Lit>::push(&local_d8);
              }
              pvVar5 = (this->in).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar19 = *(uint **)&pvVar5[uVar21].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data;
              puVar6 = (uint *)pvVar5[uVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
              if (puVar19 != puVar6) {
                iVar8 = 0;
                pcVar11 = sat.assigns.data;
                do {
                  uVar12 = *puVar19;
                  pBVar10 = (this->super_GraphPropagator).es.data;
                  uVar4 = pBVar10[uVar12].v;
                  bVar3 = pcVar11[uVar4];
                  if ((bVar3 == 0) || ((uint)pBVar10[uVar12].s * -2 + 1 == (int)(char)bVar3)) {
                    iVar8 = iVar8 + 1;
                    local_dc = uVar12;
                  }
                  else if (so.lazy == true) {
                    local_b0._a._0_4_ = (uint)(bVar3 < 0xfe) + uVar4 * 2;
                    vec<Lit>::push(&local_d8,(Lit *)&local_b0);
                    pcVar11 = sat.assigns.data;
                  }
                  puVar20 = local_48;
                  puVar19 = puVar19 + 1;
                } while (puVar19 != puVar6);
                if (iVar8 == 1) {
                  uVar21 = (ulong)local_dc;
                  pBVar10 = (this->super_GraphPropagator).es.data;
                  if (sat.assigns.data[(uint)pBVar10[uVar21].v] == '\0') {
                    aVar13 = local_60;
                    if (so.lazy == true) {
                      uVar14 = (this->super_GraphPropagator).vs.data[uVar14].v;
                      local_b0._a._0_4_ =
                           (uint)((int)sat.assigns.data[uVar14] - 1U < 0xfffffffd) + uVar14 * 2;
                      vec<Lit>::push(&local_d8,(Lit *)&local_b0);
                      uVar14 = local_d8.sz;
                      uVar21 = local_d8._0_8_ & 0xffffffff;
                      sVar17 = (ulong)(local_d8.sz - 1) * 4 + 8;
                      if (local_d8.sz == 0) {
                        sVar17 = 8;
                      }
                      local_b0._pt = (Clause *)malloc(sVar17);
                      uVar12 = uVar14 << 8;
                      (local_b0._pt)->data[0].x = -2;
                      *(uint *)local_b0._pt = uVar12;
                      if (uVar14 != 0) {
                        uVar16 = 0;
                        do {
                          (local_b0._pt)->data[uVar16].x = local_d8.data[uVar16].x;
                          uVar16 = uVar16 + 1;
                        } while (uVar21 != uVar16);
                      }
                      *(uint *)local_b0._pt = uVar12 | 2;
                      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_b0._pt);
                      local_c0._pt = local_b0._pt;
                      uVar21 = (ulong)local_dc;
                      pBVar10 = (this->super_GraphPropagator).es.data;
                      aVar13 = local_b0;
                    }
                    SAT::cEnqueue(&sat,(Lit)((uint)pBVar10[uVar21].s + pBVar10[uVar21].v * 2),
                                  (Reason)aVar13);
                    if ((char)local_b4 != '\0') {
                      iVar8 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator
                                [0x11])(this,(ulong)local_dc);
                      if ((char)iVar8 == '\0') {
                        if (local_d8.data != (Lit *)0x0) {
                          free(local_d8.data);
                        }
                        goto LAB_001ce438;
                      }
                      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                      ::_M_insert_unique<int_const&>(local_40,(int *)&local_dc);
                      aVar13._pt = (Clause *)(this->last_state_e + (int)local_dc);
                      local_a8 = *(uint *)aVar13._pt;
                      local_a4 = 4;
                      local_b0._pt = aVar13._pt;
                      vec<TrailElem>::push(local_50,(TrailElem *)&local_b0);
                      *(uint *)aVar13._pt = 0;
                    }
                  }
                }
              }
              if (local_d8.data != (Lit *)0x0) {
                free(local_d8.data);
              }
              bVar7 = true;
            }
          }
          if ((Tint *)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (Tint *)0x0
             ) {
            operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = 0;
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          }
          if (!bVar7) goto LAB_001ce5fc;
        }
        puVar22 = puVar22 + 1;
      } while (puVar22 != puVar20);
      bVar7 = true;
    }
  }
  return bVar7;
}

Assistant:

bool DReachabilityPropagator::_propagateReachability(bool local) {
	update_innodes();
	// cout <<"PROPAGATE REACHABILITY"<<endl;
	lt->init();
	lt->LengauerTarjan::DFS();
	const int reached = lt->get_visited_innodes();
	if (DEBUG) {
		std::cout << "Reached " << reached << " in_nodes_tsize " << in_nodes_tsize
							<< " in_nodes.size() " << in_nodes_list.size() << '\n';
	}

	if (reached < in_nodes_tsize) {
		// FAIL because of not reaching some other node
		if (so.lazy) {
			int some_node = -1;
			for (const int i : in_nodes_list) {
				if (!lt->visited_dfs(i)) {
					some_node = i;
				}
			}
			assert(some_node != -1);
			vec<Lit> psfail;
			psfail.push(getNodeVar(get_root_idx()).getValLit());
			assert(getNodeVar(some_node).isFixed() && getNodeVar(some_node).isTrue());
			psfail.push(getNodeVar(some_node).getValLit());
			std::vector<bool> v(nbNodes(), false);
			std::vector<bool> falsev(nbNodes(), false);
			reverseDFStoBorder(some_node, v, falsev, psfail);
			if (DEBUG) {
				std::cout << "Expl size: " << psfail.size() << '\n';
			}
			Clause* expl = Clause_new(psfail);
			expl->temp_expl = 1;
			sat.rtrail.last().push(expl);
			sat.confl = expl;
		}
		return false;
	}
	//*
	for (int i = 0; i < nbNodes(); i++) {
		if (!lt->visited_dfs(i) && !getNodeVar(i).isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				vec<Lit> ps;
				ps.push();
				ps.push(getNodeVar(get_root_idx()).getValLit());
				std::vector<bool> v(nbNodes(), false);
				std::vector<bool> falsev(nbNodes(), false);
				reverseDFStoBorder(i, v, falsev, ps);
				r = Reason_new(ps);
			}
			getNodeVar(i).setVal(false, r);
			if (local) {
				if (!propagateRemNode(i)) {
					return false;
				}
				last_state_n[i] = VT_OUT;
			}
		}
	}  //*/

	lt->find_doms();
	// for (int i = 0; i < nbNodes(); i++)
	//     cerr <<"("<<i <<","<< lt->dominator(i)<<") ";
	// cerr<<endl;

	for (const int u : in_nodes_list) {
		assert(getNodeVar(u).isFixed());
		assert(getNodeVar(u).isTrue());
		if (DEBUG) {
			std::cout << "Looking at innode? u: " << u << " " << getNodeVar(u).isFixed() << '\n';
		}
		const int dom_u = lt->dominator(u);

		if (u == dom_u || dom_u == -1) {  // At the root
			continue;
		}
		if (u == get_root_idx()) {
			continue;
		}

		std::vector<bool> visited = std::vector<bool>(nbNodes(), false);
		if (DEBUG) {
			std::cout << "STARTING DFS (avoid " << dom_u << ")" << '\n';
			std::cout << "Nodes: ";
			for (int i = 0; i < nbNodes(); i++) {
				std::cout << i << "("
									<< (getNodeVar(i).isFixed() ? (getNodeVar(i).isTrue() ? "I" : "O") : "U") << "),";
			}
			std::cout << '\n';
			std::cout << "Edges: ";
			for (int i = 0; i < nbEdges(); i++) {
				std::cout << i << "[" << getTail(i) << "," << getHead(i) << "]"
									<< "(" << (getEdgeVar(i).isFixed() ? (getEdgeVar(i).isTrue() ? "I" : "O") : "U")
									<< "),";
			}
			std::cout << '\n';
		}
		assert(correctDominator(get_root_idx(), visited, dom_u));
		if (visited[u]) {
			std::cout << dom_u << " " << u << " " << get_root_idx() << '\n';
		}
		assert(!visited[u]);

		Clause* r = nullptr;

		if (!getNodeVar(dom_u).isFixed()) {
			// Fix the dominator
			//*
			if (so.lazy) {
				explain_dominator(u, dom_u, &r);
			}

			if (DEBUG) {
				std::cout << "Adding innode " << __FILE__ << __LINE__ << "(" << dom_u << " dominates " << u
									<< ")" << '\n';
			}
			getNodeVar(dom_u).setVal(true, r);
			if (local) {
				add_innode(dom_u);
				if (!propagateNewNode(dom_u)) {
					return false;
				}
				last_state_n[dom_u] = VT_IN;
				new_node.insert(dom_u);
			}
			//*/
		}

		if (getNodeVar(dom_u).isFixed() && getNodeVar(dom_u).isTrue()) {
			// Find bridge if any and enforce its endpoints
			int in_deg = 0;
			int last_incident = -1;
			vec<Lit> ps_in;
			if (so.lazy) {
				ps_in.push();
			}
			for (const int ie : in[u]) {
				if (!getEdgeVar(ie).isFixed() || getEdgeVar(ie).isTrue()) {
					in_deg++;
					last_incident = ie;
				} else if (so.lazy) {
					ps_in.push(getEdgeVar(ie).getValLit());
				}
			}
			if (in_deg == 1 && !getEdgeVar(last_incident).isFixed()) {
				//*
				if (so.lazy) {
					// ps_in.push(getNodeVar(dom_u).getValLit());
					ps_in.push(getNodeVar(u).getValLit());
					r = Reason_new(ps_in);
				}
				getEdgeVar(last_incident).setVal(true, r);
				if (local) {
					if (!propagateNewEdge(last_incident)) {
						return false;
					}
					if (DEBUG) {
						std::cout << "Adding inedge " << last_incident << " " << __FILE__ << __LINE__ << "("
											<< dom_u << " dominates " << u << ")" << '\n';
					}
					new_edge.insert(last_incident);
					last_state_e[last_incident] = VT_IN;
				}
				//*/
			}
		}
	}

	return true;
}